

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

double __thiscall despot::Logger::StderrUndiscountedRoundReward(Logger *this)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pdVar2 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar3 - (long)pdVar2 >> 3;
  dVar7 = 0.0;
  dVar6 = 0.0;
  dVar8 = 0.0;
  if (pdVar3 != pdVar2) {
    lVar5 = 0;
    do {
      dVar1 = pdVar2[lVar5];
      dVar8 = dVar8 + dVar1;
      dVar6 = dVar6 + dVar1 * dVar1;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  if (0 < (int)lVar4) {
    dVar7 = (double)(int)lVar4;
    dVar7 = (dVar6 / dVar7) / dVar7 - (((dVar8 * dVar8) / dVar7) / dVar7) / dVar7;
    if (dVar7 < 0.0) {
      dVar6 = sqrt(dVar7);
      return dVar6;
    }
    dVar7 = SQRT(dVar7);
  }
  return dVar7;
}

Assistant:

double Logger::StderrUndiscountedRoundReward() const {
	double sum = 0, sum2 = 0;
	for (int i = 0; i < undiscounted_round_rewards_.size(); i++) {
		double reward = undiscounted_round_rewards_[i];
		sum += reward;
		sum2 += reward * reward;
	}
	int n = undiscounted_round_rewards_.size();
	return n > 0 ? sqrt(sum2 / n / n - sum * sum / n / n / n) : 0.0;
}